

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O0

void diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::dequeue_values
               (vector<float,_std::allocator<float>_> *v,ReduceProxy *rp,bool skip_self)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  size_t sVar4;
  float *__last;
  byte in_DL;
  ReduceProxy *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  bool bVar5;
  double __x;
  float *bg;
  size_t incoming_sz;
  MemoryBuffer *in_1;
  int i_1;
  MemoryBuffer *in;
  int i;
  size_t end;
  size_t sz;
  int k_in;
  shared_ptr<diy::spd::logger> log;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  Proxy *in_stack_fffffffffffffea0;
  float *__first;
  size_type in_stack_fffffffffffffeb8;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffec0;
  size_type local_c0;
  float *local_b8;
  ulong local_b0;
  BlockID local_a8;
  MemoryBuffer *local_a0;
  BlockID local_94;
  int local_8c;
  BlockID local_88;
  MemoryBuffer *local_80;
  BlockID local_74;
  BlockID local_6c;
  int local_64;
  size_type local_60;
  unsigned_long local_58;
  size_type local_50 [3];
  uint local_34;
  int local_30;
  int local_2c;
  byte local_11;
  ReduceProxy *local_10;
  vector<float,_std::allocator<float>_> *local_8;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  get_logger();
  ReduceProxy::in_link(local_10);
  local_2c = Link::size((Link *)0x1a61fc);
  peVar3 = std::__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1a6210);
  local_30 = Master::Proxy::gid(&local_10->super_Proxy);
  ReduceProxy::round(local_10,__x);
  local_50[0] = std::vector<float,_std::allocator<float>_>::size(local_8);
  spd::logger::trace<int,unsigned_int,unsigned_long>
            (peVar3,"dequeue_values(): gid={}, round={}; v.size()={}",&local_30,&local_34,local_50);
  local_58 = 0;
  local_60 = std::vector<float,_std::allocator<float>_>::size(local_8);
  for (local_64 = 0; local_64 < local_2c; local_64 = local_64 + 1) {
    peVar3 = std::__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a62e0);
    ReduceProxy::in_link(local_10);
    local_6c = Link::target((Link *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),0)
    ;
    spd::logger::trace<int,unsigned_long>
              (peVar3,"    incoming size from {}: {}",&local_6c.gid,&local_58);
    bVar5 = false;
    if ((local_11 & 1) != 0) {
      ReduceProxy::in_link(local_10);
      local_74 = Link::target((Link *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                              0);
      iVar1 = local_74.gid;
      iVar2 = Master::Proxy::gid(&local_10->super_Proxy);
      bVar5 = iVar1 == iVar2;
    }
    if (!bVar5) {
      ReduceProxy::in_link(local_10);
      local_88 = Link::target((Link *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                              0);
      local_80 = Master::Proxy::incoming(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
      sVar4 = MemoryBuffer::size((MemoryBuffer *)0x1a6447);
      local_58 = (sVar4 >> 2) + local_58;
    }
  }
  peVar3 = std::__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1a647e);
  spd::logger::trace<unsigned_long>(peVar3,"    incoming size: {}",&local_58);
  std::vector<float,_std::allocator<float>_>::resize
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  for (local_8c = 0; local_8c < local_2c; local_8c = local_8c + 1) {
    bVar5 = false;
    if ((local_11 & 1) != 0) {
      ReduceProxy::in_link(local_10);
      local_94 = Link::target((Link *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                              0);
      iVar1 = local_94.gid;
      iVar2 = Master::Proxy::gid(&local_10->super_Proxy);
      bVar5 = iVar1 == iVar2;
    }
    if (!bVar5) {
      ReduceProxy::in_link(local_10);
      local_a8 = Link::target((Link *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                              0);
      local_a0 = Master::Proxy::incoming(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
      sVar4 = MemoryBuffer::size((MemoryBuffer *)0x1a65b5);
      local_b0 = sVar4 >> 2;
      __last = (float *)std::vector<char,_std::allocator<char>_>::operator[](&local_a0->buffer,0);
      __first = __last + local_b0;
      local_b8 = __last;
      std::vector<float,_std::allocator<float>_>::operator[](local_8,local_60);
      std::copy<float*,float*>(__first,__last,(float *)in_stack_fffffffffffffea0);
      local_60 = local_b0 + local_60;
    }
  }
  peVar3 = std::__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1a6660);
  local_c0 = std::vector<float,_std::allocator<float>_>::size(local_8);
  spd::logger::trace<unsigned_long>(peVar3,"    v.size()={}",&local_c0);
  std::shared_ptr<diy::spd::logger>::~shared_ptr((shared_ptr<diy::spd::logger> *)0x1a66a2);
  return;
}

Assistant:

static void     dequeue_values(std::vector<T>& v, const ReduceProxy& rp, bool skip_self = true)
    {
        auto log = get_logger();

        int k_in  = rp.in_link().size();

        log->trace("dequeue_values(): gid={}, round={}; v.size()={}", rp.gid(), rp.round(), v.size());

        if (detail::is_default< Serialization<T> >::value)
        {
            // add up sizes
            size_t sz = 0;
            size_t end = v.size();
            for (int i = 0; i < k_in; ++i)
            {
                log->trace("    incoming size from {}: {}", rp.in_link().target(i).gid, sz);
                if (skip_self && rp.in_link().target(i).gid == rp.gid()) continue;
                MemoryBuffer& in = rp.incoming(rp.in_link().target(i).gid);
                sz += in.size() / sizeof(T);
            }
            log->trace("    incoming size: {}", sz);
            v.resize(end + sz);

            for (int i = 0; i < k_in; ++i)
            {
                if (skip_self && rp.in_link().target(i).gid == rp.gid()) continue;
                MemoryBuffer& in = rp.incoming(rp.in_link().target(i).gid);
                size_t incoming_sz = in.size() / sizeof(T);
                T* bg = (T*) &in.buffer[0];
                std::copy(bg, bg + incoming_sz, &v[end]);
                end += incoming_sz;
            }
        } else
        {
            for (int i = 0; i < k_in; ++i)
            {
                if (skip_self && rp.in_link().target(i).gid == rp.gid()) continue;
                MemoryBuffer& in = rp.incoming(rp.in_link().target(i).gid);
                while(in)
                {
                    T x;
                    diy::load(in, x);
                    v.emplace_back(std::move(x));
                }
            }
        }
        log->trace("    v.size()={}", v.size());
    }